

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opnmidi_midiplay.cpp
# Opt level: O3

bool __thiscall OPNMIDIplay::doYamahaSysEx(OPNMIDIplay *this,uint dev,uint8_t *data,size_t size)

{
  DebugMessageHook p_Var1;
  bool bVar2;
  
  bVar2 = false;
  if ((((size != 0) && (dev == 0x7f || (dev & 0xf) == (uint)this->m_sysExDeviceId)) &&
      (bVar2 = false, 3 < size)) &&
     ((((dev & 0xf0 | (*data & 0x7f) << 8) == 0x4c10 && (bVar2 = false, size == 5)) &&
      ((data[3] & 0x7f | (data[2] & 0x7f) << 8 | (data[1] & 0x7f) << 0x10) == 0x7e)))) {
    p_Var1 = (this->hooks).onDebugMessage;
    if (p_Var1 != (DebugMessageHook)0x0) {
      (*p_Var1)((this->hooks).onDebugMessage_userData,"SysEx: Caught Yamaha XG System On: %02X",
                (ulong)(data[4] & 0x7f));
    }
    this->m_synthMode = 2;
    realTime_ResetState(this);
    bVar2 = true;
  }
  return bVar2;
}

Assistant:

bool OPNMIDIplay::doYamahaSysEx(unsigned dev, const uint8_t *data, size_t size)
{
    bool devicematch = dev == 0x7F || (dev & 0x0F) == m_sysExDeviceId;
    if(size < 1 || !devicematch)
        return false;

    unsigned model = data[0] & 0x7F;
    ++data;
    --size;

    switch((model << 8) | (dev & 0xF0))
    {
    case (YamahaModel_XG << 8) | 0x10:  // parameter change
    {
        if(size < 3)
            break;

        unsigned address =
            (((unsigned)data[0] & 0x7F) << 16) |
            (((unsigned)data[1] & 0x7F) << 8)  |
            (((unsigned)data[2] & 0x7F));
        data += 3;
        size -= 3;

        switch(address)
        {
        case 0x00007E:  // XG System On
            if(size != 1)
                break;
            unsigned value = data[0] & 0x7F;
            ADL_UNUSED(value);//TODO: Hook this correctly!
            if(hooks.onDebugMessage)
                hooks.onDebugMessage(hooks.onDebugMessage_userData, "SysEx: Caught Yamaha XG System On: %02X", value);
            m_synthMode = Mode_XG;
            realTime_ResetState();
            return true;
        }

        break;
    }
    }

    return false;
}